

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O2

PrimInfo * __thiscall
embree::avx2::LineSegmentsISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,LineSegmentsISA *this,mvector<PrimRef> *prims,
          size_t itime,range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  PrimRef *pPVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  float fVar7;
  ulong uVar8;
  size_t sVar9;
  size_t *psVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  size_t local_60;
  undefined1 auVar17 [64];
  undefined1 auVar19 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar13 = r->_begin;
  auVar18._8_4_ = 0x7f800000;
  auVar18._0_8_ = 0x7f8000007f800000;
  auVar18._12_4_ = 0x7f800000;
  auVar19 = ZEXT1664(auVar18);
  auVar16._8_4_ = 0xff800000;
  auVar16._0_8_ = 0xff800000ff800000;
  auVar16._12_4_ = 0xff800000;
  auVar17 = ZEXT1664(auVar16);
  local_60 = 0;
  auVar20._8_4_ = 0xddccb9a2;
  auVar20._0_8_ = 0xddccb9a2ddccb9a2;
  auVar20._12_4_ = 0xddccb9a2;
  auVar21._8_4_ = 0x5dccb9a2;
  auVar21._0_8_ = 0x5dccb9a25dccb9a2;
  auVar21._12_4_ = 0x5dccb9a2;
  auVar22 = ZEXT1664(auVar16);
  auVar23 = ZEXT1664(auVar18);
LAB_014ff1ab:
  if (r->_end <= uVar13) {
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
         = auVar23._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
         = auVar22._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
         = auVar19._0_16_;
    (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
         = auVar17._0_16_;
    __return_storage_ptr__->end = local_60;
    return __return_storage_ptr__;
  }
  pBVar2 = (this->super_LineSegments).vertices.items;
  uVar1 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                   *(long *)&(this->super_LineSegments).field_0x68 * uVar13);
  uVar14 = (ulong)uVar1;
  uVar11 = (ulong)(uVar1 + 1);
  if (uVar11 < (pBVar2->super_RawBufferView).num) {
    psVar10 = &pBVar2[itime].super_RawBufferView.stride;
    uVar8 = itime - 1;
    do {
      uVar8 = uVar8 + 1;
      if (itime < uVar8) {
        psVar10 = &pBVar2[itime + 1].super_RawBufferView.stride;
        sVar9 = itime;
        goto LAB_014ff26e;
      }
      auVar16 = *(undefined1 (*) [16])
                 (((RawBufferView *)(psVar10 + -2))->ptr_ofs + *psVar10 * uVar14);
      auVar18 = vcmpps_avx(auVar16,auVar20,2);
      auVar24 = vcmpps_avx(auVar16,auVar21,5);
      auVar18 = vorps_avx(auVar18,auVar24);
      if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar18[0xf] < '\0'
         ) break;
      auVar18 = *(undefined1 (*) [16])
                 (((RawBufferView *)(psVar10 + -2))->ptr_ofs + *psVar10 * uVar11);
      auVar24 = vcmpps_avx(auVar18,auVar20,2);
      auVar25 = vcmpps_avx(auVar18,auVar21,5);
      auVar24 = vorps_avx(auVar24,auVar25);
      if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar24[0xf] < '\0'
         ) break;
      psVar10 = psVar10 + 7;
      auVar16 = vshufps_avx(auVar16,auVar16,0xff);
      auVar18 = vshufps_avx(auVar18,auVar18,0xff);
      auVar16 = vminss_avx(auVar16,auVar18);
    } while (0.0 <= auVar16._0_4_);
  }
  goto LAB_014ff387;
  while( true ) {
    auVar16 = *(undefined1 (*) [16])(((RawBufferView *)(psVar10 + -2))->ptr_ofs + *psVar10 * uVar14)
    ;
    auVar18 = vcmpps_avx(auVar16,auVar20,2);
    auVar24 = vcmpps_avx(auVar16,auVar21,5);
    auVar18 = vorps_avx(auVar18,auVar24);
    if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar18[0xf] < '\0')
    break;
    auVar18 = *(undefined1 (*) [16])(((RawBufferView *)(psVar10 + -2))->ptr_ofs + *psVar10 * uVar11)
    ;
    auVar24 = vcmpps_avx(auVar18,auVar20,2);
    auVar25 = vcmpps_avx(auVar18,auVar21,5);
    auVar24 = vorps_avx(auVar24,auVar25);
    if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar24[0xf] < '\0')
    break;
    psVar10 = psVar10 + 7;
    auVar16 = vshufps_avx(auVar16,auVar16,0xff);
    auVar18 = vshufps_avx(auVar18,auVar18,0xff);
    auVar16 = vminss_avx(auVar16,auVar18);
    if (auVar16._0_4_ < 0.0) break;
LAB_014ff26e:
    sVar9 = sVar9 + 1;
    if (itime + 1 < sVar9) {
      pcVar3 = pBVar2[itime].super_RawBufferView.ptr_ofs;
      sVar9 = pBVar2[itime].super_RawBufferView.stride;
      lVar15 = uVar14 * sVar9;
      lVar12 = uVar11 * sVar9;
      auVar24 = vminps_avx(*(undefined1 (*) [16])(pcVar3 + lVar15),
                           *(undefined1 (*) [16])(pcVar3 + lVar12));
      auVar16 = vmaxps_avx(*(undefined1 (*) [16])(pcVar3 + lVar15),
                           *(undefined1 (*) [16])(pcVar3 + lVar12));
      auVar18 = vmaxss_avx(ZEXT416(*(uint *)(pcVar3 + lVar12 + 0xc)),
                           ZEXT416(*(uint *)(pcVar3 + lVar15 + 0xc)));
      fVar7 = auVar18._0_4_ * (this->super_LineSegments).maxRadiusScale;
      auVar25._4_4_ = fVar7;
      auVar25._0_4_ = fVar7;
      auVar25._8_4_ = fVar7;
      auVar25._12_4_ = fVar7;
      auVar18 = vsubps_avx(auVar24,auVar25);
      aVar5 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar18,ZEXT416(geomID),0x30);
      auVar24._0_4_ = auVar16._0_4_ + fVar7;
      auVar24._4_4_ = auVar16._4_4_ + fVar7;
      auVar24._8_4_ = auVar16._8_4_ + fVar7;
      auVar24._12_4_ = auVar16._12_4_ + fVar7;
      aVar6 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
              vinsertps_avx(auVar24,ZEXT416((uint)uVar13),0x30);
      auVar16 = vminps_avx((undefined1  [16])auVar23._0_16_,(undefined1  [16])aVar5);
      auVar23 = ZEXT1664(auVar16);
      auVar16 = vmaxps_avx((undefined1  [16])auVar22._0_16_,(undefined1  [16])aVar6);
      auVar22 = ZEXT1664(auVar16);
      auVar26._0_4_ = aVar5.x + aVar6.x;
      auVar26._4_4_ = aVar5.y + aVar6.y;
      auVar26._8_4_ = aVar5.z + aVar6.z;
      auVar26._12_4_ = aVar5.field_3.w + aVar6.field_3.w;
      auVar16 = vminps_avx((undefined1  [16])auVar19._0_16_,auVar26);
      auVar19 = ZEXT1664(auVar16);
      auVar16 = vmaxps_avx((undefined1  [16])auVar17._0_16_,auVar26);
      auVar17 = ZEXT1664(auVar16);
      local_60 = local_60 + 1;
      pPVar4 = prims->items;
      pPVar4[k].upper.field_0.field_1 = aVar6;
      pPVar4[k].lower.field_0.field_1 = aVar5;
      k = k + 1;
      break;
    }
  }
LAB_014ff387:
  uVar13 = uVar13 + 1;
  goto LAB_014ff1ab;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }